

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_set.cpp
# Opt level: O3

unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>,_true> __thiscall
duckdb::Transformer::TransformSet(Transformer *this,PGVariableSetStmt *stmt)

{
  NotImplementedException *this_00;
  long in_RDX;
  string local_40;
  
  if (*(int *)(in_RDX + 4) == 0) {
    TransformSetVariable(this,stmt);
  }
  else {
    if (*(int *)(in_RDX + 4) != 4) {
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Can only SET or RESET a variable","");
      NotImplementedException::NotImplementedException(this_00,&local_40);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    TransformResetVariable(this,stmt);
  }
  return (unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>_>)
         (unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>_>)this;
}

Assistant:

unique_ptr<SetStatement> Transformer::TransformSet(duckdb_libpgquery::PGVariableSetStmt &stmt) {
	D_ASSERT(stmt.type == duckdb_libpgquery::T_PGVariableSetStmt);

	SetType set_type = ToSetType(stmt.kind);
	switch (set_type) {
	case SetType::SET:
		return TransformSetVariable(stmt);
	case SetType::RESET:
		return TransformResetVariable(stmt);
	default:
		throw InternalException("Type not implemented for SetType");
	}
}